

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

value_type * __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::load_leaf_node(value_type *__return_storage_ptr__,
                hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *this,database *db,address addr)

{
  database_reader *archive;
  database_reader local_58;
  pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> local_48;
  database *local_20;
  database *db_local;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  address addr_local;
  
  local_20 = db;
  db_local = (database *)this;
  this_local = (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)addr.a_;
  serialize::archive::database_reader::database_reader(&local_58,db,addr);
  serialize::
  read<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>,pstore::serialize::archive::database_reader>
            (&local_48,(serialize *)&local_58,archive);
  std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>::
  pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_true>
            (__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::load_leaf_node (database const & db,
                                                                           address const addr) const
            -> value_type {

            return serialize::read<std::pair<KeyType, ValueType>> (
                serialize::archive::database_reader{db, addr});
        }